

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  int iVar1;
  void **ppvVar2;
  FileDescriptorProto *from_00;
  LogMessage *other;
  FileDescriptorProto *this_00;
  string *psVar3;
  int iVar4;
  long lVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x1ad);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
             (from->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
             (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->file_to_generate_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar4) {
        ppvVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
        (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar3 = (string *)ppvVar2[iVar1];
      }
      else {
        if (iVar4 == (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_to_generate_).super_RepeatedPtrFieldBase,iVar4 + 1);
          iVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_ = iVar4 + 1;
        psVar3 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar2[iVar1] = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (from->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->proto_file_).super_RepeatedPtrFieldBase,
             (from->proto_file_).super_RepeatedPtrFieldBase.current_size_ +
             (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      from_00 = (FileDescriptorProto *)
                (from->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar5];
      iVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar4) {
        ppvVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        this_00 = (FileDescriptorProto *)ppvVar2[iVar1];
      }
      else {
        if (iVar4 == (this->proto_file_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar4 + 1);
          iVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar4 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar2[iVar1] = this_00;
      }
      FileDescriptorProto::MergeFrom(this_00,from_00);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (from->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((from->_has_bits_[0] & 2) != 0) {
    this->_has_bits_[0] = this->_has_bits_[0] | 2;
    psVar3 = this->parameter_;
    if (psVar3 == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar3 = (string *)operator_new(0x20);
      (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
      psVar3->_M_string_length = 0;
      (psVar3->field_2)._M_local_buf[0] = '\0';
      this->parameter_ = psVar3;
    }
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
  GOOGLE_CHECK_NE(&from, this);
  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_parameter()) {
      set_parameter(from.parameter());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}